

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O0

bool __thiscall spvtools::opt::Instruction::IsFoldable(Instruction *this)

{
  bool bVar1;
  IRContext *this_00;
  InstructionFolder *this_01;
  undefined1 local_11;
  Instruction *this_local;
  
  bVar1 = IsFoldableByFoldScalar(this);
  local_11 = true;
  if (!bVar1) {
    bVar1 = IsFoldableByFoldVector(this);
    local_11 = true;
    if (!bVar1) {
      this_00 = context(this);
      this_01 = IRContext::get_instruction_folder(this_00);
      local_11 = InstructionFolder::HasConstFoldingRule(this_01,this);
    }
  }
  return local_11;
}

Assistant:

bool Instruction::IsFoldable() const {
  return IsFoldableByFoldScalar() || IsFoldableByFoldVector() ||
         context()->get_instruction_folder().HasConstFoldingRule(this);
}